

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
stringToUnits_specificCombinations_Test::TestBody(stringToUnits_specificCombinations_Test *this)

{
  unit_data uVar1;
  uint extraout_EAX;
  uint64_t uVar2;
  pointer *__ptr;
  char *pcVar3;
  double in_XMM1_Qa;
  precise_unit local_a8;
  internal local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  precise_unit local_88;
  long *local_78;
  string local_70;
  string local_50;
  string local_30;
  
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::kg + 8),(unit_data *)(units::precise::m + 8));
  local_a8._8_8_ = ZEXT48((uint)uVar1);
  local_a8.multiplier_ = 1.0;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"kg m","");
  uVar2 = units::getDefaultFlags();
  local_88 = units::unit_from_string(&local_30,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_98,"precise::kg * precise::m","unit_from_string(\"kg m\")",&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x278,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_a8.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8.multiplier_ + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78 = (long *)units::detail::power_const<double>(1.0,2);
  units::detail::unit_data::pow((unit_data *)(units::precise::s + 8),(double)local_78,in_XMM1_Qa);
  local_a8._8_8_ = ZEXT48(extraout_EAX);
  local_a8.multiplier_ = (double)local_78;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sq s","");
  uVar2 = units::getDefaultFlags();
  local_88 = units::unit_from_string(&local_50,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_98,"precise::s.pow(2)","unit_from_string(\"sq s\")",&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x279,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_a8.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8.multiplier_ + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::kg + 8),(unit_data *)(units::precise::L + 8));
  local_a8._8_8_ = ZEXT48((uint)uVar1);
  local_a8.multiplier_ = (double)&DAT_3f50624dd2f1a9fc;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"kg l","");
  uVar2 = units::getDefaultFlags();
  local_88 = units::unit_from_string(&local_70,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_98,"precise::kg * precise::L","unit_from_string(\"kg l\")",&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x27a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_a8.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8.multiplier_ + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  return;
}

Assistant:

TEST(stringToUnits, equivalents2)
{
    EXPECT_EQ(unit_from_string("in us"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("us in"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("[in_us]"), unit_from_string("inch - US"));
    EXPECT_EQ(unit_from_string("CXCUN[1]^-1"), unit_from_string("/[arb'U]"));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"), unit_from_string("CCID<sub>50</sub> "));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"),
        unit_from_string("CCID<sub>50<\\/sub> "));
    EXPECT_EQ(
        unit_from_string("/100 neutrophils"),
        unit_from_string("/100{neutrophils}"));
    EXPECT_EQ(unit_from_string("carat/cubic inch"), unit_from_string("ct/in3"));
    EXPECT_EQ(
        unit_from_string("10.(UN.S)/(CM5.M2)", case_insensitive),
        unit_from_string("10.uN.s/(cm5.m2)"));
    EXPECT_EQ(unit_from_string("imperial miles"), unit_from_string("mi_br"));
    EXPECT_EQ(unit_from_string("cup us"), precise::us::cup);
    EXPECT_EQ(unit_from_string(" per sec"), unit_from_string("/s"));
    EXPECT_EQ(unit_from_string("ampere-hour"), unit_from_string("A.h"));
    EXPECT_EQ(
        unit_from_string("mL/cm[H2O]"),
        unit_from_string("milliliter per centimeter of water"));
    EXPECT_EQ(unit_from_string("sq m"), unit_from_string("m2"));
    EXPECT_EQ(unit_from_string("U/ 12hrs"), unit_from_string("U/(12.h)"));
    EXPECT_EQ(unit_from_string("Ncm"), unit_from_string("N.cm"));
    EXPECT_EQ(unit_from_string("ohm reciprocal"), unit_from_string("mho"));
    EXPECT_EQ(unit_from_string("per mins"), unit_from_string("/min"));
    EXPECT_EQ(unit_from_string("/100 WBCs"), unit_from_string("/100{WBCs}"));

    EXPECT_EQ(
        unit_from_string("lumen meters squared"), unit_from_string("lm.m2"));
}